

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

void cf_hc_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  void *pvVar1;
  _Bool _Var2;
  cf_hc_baller *b_00;
  cf_hc_baller *b;
  size_t i;
  cf_hc_ctx *ctx;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  if ((cf->field_0x24 & 1) == 0) {
    pvVar1 = cf->ctx;
    for (b = (cf_hc_baller *)0x0; b < *(cf_hc_baller **)((long)pvVar1 + 0x98);
        b = (cf_hc_baller *)((long)&b->name + 1)) {
      b_00 = (cf_hc_baller *)((long)pvVar1 + (long)b * 0x38 + 0x28);
      _Var2 = cf_hc_baller_is_active(b_00);
      if (_Var2) {
        Curl_conn_cf_adjust_pollset(b_00->cf,data,ps);
      }
    }
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"adjust_pollset -> %d socks",(ulong)ps->num);
    }
  }
  return;
}

Assistant:

static void cf_hc_adjust_pollset(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  struct easy_pollset *ps)
{
  if(!cf->connected) {
    struct cf_hc_ctx *ctx = cf->ctx;
    size_t i;

    for(i = 0; i < ctx->baller_count; i++) {
      struct cf_hc_baller *b = &ctx->ballers[i];
      if(!cf_hc_baller_is_active(b))
        continue;
      Curl_conn_cf_adjust_pollset(b->cf, data, ps);
    }
    CURL_TRC_CF(data, cf, "adjust_pollset -> %d socks", ps->num);
  }
}